

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O0

Oop __thiscall Lodtalk::VMContext::setGlobalVariable(VMContext *this,char *name,Oop value)

{
  allocator local_51;
  string local_50;
  anon_union_8_4_0eb573b0_for_Oop_0 local_30;
  char *local_28;
  char *name_local;
  VMContext *this_local;
  Oop value_local;
  
  local_28 = name;
  name_local = (char *)this;
  this_local = (VMContext *)value.field_0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,name,&local_51);
  local_30 = (anon_union_8_4_0eb573b0_for_Oop_0)ByteSymbol::fromNative(this,&local_50);
  value_local = setGlobalVariable(this,(Oop)local_30,(Oop)this_local);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return (Oop)value_local.field_0.pointer;
}

Assistant:

Oop VMContext::setGlobalVariable(const char *name, Oop value)
{
	return setGlobalVariable(ByteSymbol::fromNative(this, name), value);
}